

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_transaction.cpp
# Opt level: O1

int CfdAddScriptHashSign
              (void *handle,int net_type,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,
              char *redeem_script,bool clear_stack,char **tx_string)

{
  pointer *ppuVar1;
  bool bVar2;
  AddressType address_type;
  uint32_t uVar3;
  char *pcVar4;
  CfdException *pCVar5;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> list;
  TransactionContext tx;
  OutPoint outpoint;
  Script script;
  allocator local_1aa;
  bool local_1a9;
  void *local_1a8;
  Script local_1a0;
  vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_> local_168;
  ConfidentialTransactionContext local_148;
  OutPoint local_90;
  Script local_68;
  
  local_1a8 = handle;
  cfd::Initialize();
  bVar2 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar2) {
    local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f647a;
    local_148.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
         0x6b7;
    local_148.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5f67dd;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_148,kCfdLogLevelWarning,"tx is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_148.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_148);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(txid);
  if (bVar2) {
    local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f647a;
    local_148.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
         0x6bd;
    local_148.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5f67dd;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_148,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_148.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_148);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar2 = cfd::capi::IsEmptyString(redeem_script);
  if (bVar2) {
    local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)0x5f647a;
    local_148.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ =
         0x6c3;
    local_148.super_ConfidentialTransaction.vin_.
    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x5f67dd;
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&local_148,kCfdLogLevelWarning,"redeem_script is null or empty."
              );
    pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
    local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&local_148.super_ConfidentialTransaction.vin_;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_148,"Failed to parameter. redeem_script is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_148);
    __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (tx_string != (char **)0x0) {
    address_type = cfd::capi::ConvertHashToAddressType(0);
    local_1a9 = false;
    cfd::capi::ConvertNetType(net_type,&local_1a9);
    std::__cxx11::string::string((string *)&local_68,txid,(allocator *)&local_1a0);
    cfd::core::Txid::Txid((Txid *)&local_148,(string *)&local_68);
    cfd::core::OutPoint::OutPoint(&local_90,(Txid *)&local_148,vout);
    local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
         (_func_int **)&PTR__Txid_00735400;
    if ((void *)CONCAT44(local_148.super_ConfidentialTransaction.super_AbstractTransaction.
                         wally_tx_pointer_._4_4_,
                         local_148.super_ConfidentialTransaction.super_AbstractTransaction.
                         wally_tx_pointer_._0_4_) != (void *)0x0) {
      operator_delete((void *)CONCAT44(local_148.super_ConfidentialTransaction.
                                       super_AbstractTransaction.wally_tx_pointer_._4_4_,
                                       local_148.super_ConfidentialTransaction.
                                       super_AbstractTransaction.wally_tx_pointer_._0_4_));
    }
    if (local_68._vptr_Script !=
        (_func_int **)
        ((long)&local_68.script_data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data + 8U)) {
      operator_delete(local_68._vptr_Script);
    }
    local_168.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&local_148,redeem_script,(allocator *)&local_1a0);
    cfd::core::Script::Script(&local_68,(string *)&local_148);
    if ((vector<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_> *)
        local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction
        != &local_148.super_ConfidentialTransaction.vin_) {
      operator_delete(local_148.super_ConfidentialTransaction.super_AbstractTransaction.
                      _vptr_AbstractTransaction);
    }
    if (local_1a9 == true) {
      std::__cxx11::string::string((string *)&local_1a0,tx_hex_string,&local_1aa);
      cfd::TransactionContext::TransactionContext
                ((TransactionContext *)&local_148,(string *)&local_1a0);
      ppuVar1 = (pointer *)
                ((long)&local_1a0.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (local_1a0._vptr_Script != (_func_int **)ppuVar1) {
        operator_delete(local_1a0._vptr_Script);
      }
      uVar3 = cfd::TransactionContext::GetTxInIndex((TransactionContext *)&local_148,&local_90);
      if (clear_stack) {
        if (address_type - kP2wshAddress < 0xfffffffe) {
          cfd::core::Transaction::RemoveScriptWitnessStackAll((Transaction *)&local_148,uVar3);
        }
        else {
          cfd::core::Script::Script(&local_1a0);
          cfd::core::Transaction::SetUnlockingScript((Transaction *)&local_148,uVar3,&local_1a0);
          cfd::core::Script::~Script(&local_1a0);
        }
      }
      cfd::TransactionContext::AddScriptHashSign
                ((TransactionContext *)&local_148,&local_90,&local_168,&local_68,address_type,false)
      ;
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&local_1a0,(AbstractTransaction *)&local_148);
      pcVar4 = cfd::capi::CreateString((string *)&local_1a0);
      *tx_string = pcVar4;
      if (local_1a0._vptr_Script != (_func_int **)ppuVar1) {
        operator_delete(local_1a0._vptr_Script);
      }
      cfd::TransactionContext::~TransactionContext((TransactionContext *)&local_148);
    }
    else {
      std::__cxx11::string::string((string *)&local_1a0,tx_hex_string,&local_1aa);
      cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
                (&local_148,(string *)&local_1a0);
      ppuVar1 = (pointer *)
                ((long)&local_1a0.script_data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data + 8);
      if (local_1a0._vptr_Script != (_func_int **)ppuVar1) {
        operator_delete(local_1a0._vptr_Script);
      }
      uVar3 = cfd::ConfidentialTransactionContext::GetTxInIndex(&local_148,&local_90);
      if (clear_stack) {
        if (address_type - kP2wshAddress < 0xfffffffe) {
          cfd::core::ConfidentialTransaction::RemoveScriptWitnessStackAll
                    (&local_148.super_ConfidentialTransaction,uVar3);
        }
        else {
          cfd::core::Script::Script(&local_1a0);
          cfd::core::ConfidentialTransaction::SetUnlockingScript
                    (&local_148.super_ConfidentialTransaction,uVar3,&local_1a0);
          cfd::core::Script::~Script(&local_1a0);
        }
      }
      cfd::ConfidentialTransactionContext::AddScriptHashSign
                (&local_148,&local_90,&local_168,&local_68,address_type,false);
      cfd::core::AbstractTransaction::GetHex_abi_cxx11_
                ((string *)&local_1a0,(AbstractTransaction *)&local_148);
      pcVar4 = cfd::capi::CreateString((string *)&local_1a0);
      *tx_string = pcVar4;
      if (local_1a0._vptr_Script != (_func_int **)ppuVar1) {
        operator_delete(local_1a0._vptr_Script);
      }
      cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&local_148);
    }
    cfd::core::Script::~Script(&local_68);
    std::vector<cfd::SignParameter,_std::allocator<cfd::SignParameter>_>::~vector(&local_168);
    local_90.txid_._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
    if (local_90.txid_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_90.txid_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
  local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)0x5f647a;
  local_148.super_ConfidentialTransaction.super_AbstractTransaction.wally_tx_pointer_._0_4_ = 0x6c9;
  local_148.super_ConfidentialTransaction.vin_.
  super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x5f67dd;
  cfd::core::logger::log<>((CfdSourceLocation *)&local_148,kCfdLogLevelWarning,"tx output is null.")
  ;
  pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
  local_148.super_ConfidentialTransaction.super_AbstractTransaction._vptr_AbstractTransaction =
       (_func_int **)&local_148.super_ConfidentialTransaction.vin_;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"Failed to parameter. tx output is null.","");
  cfd::core::CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,(string *)&local_148);
  __cxa_throw(pCVar5,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdAddScriptHashSign(
    void* handle, int net_type, const char* tx_hex_string, const char* txid,
    uint32_t vout, int hash_type, const char* redeem_script, bool clear_stack,
    char** tx_string) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (IsEmptyString(redeem_script)) {
      warn(CFD_LOG_SOURCE, "redeem_script is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. redeem_script is null or empty.");
    }
    if (tx_string == nullptr) {
      warn(CFD_LOG_SOURCE, "tx output is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx output is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    bool is_witness = true;
    if ((addr_type == AddressType::kP2shAddress) ||
        (addr_type == AddressType::kP2pkhAddress)) {
      is_witness = false;
    }

    bool is_bitcoin = false;
    ConvertNetType(net_type, &is_bitcoin);
    OutPoint outpoint(Txid(txid), vout);
    std::vector<SignParameter> list;
    Script script = Script(std::string(redeem_script));
    if (is_bitcoin) {
      TransactionContext tx(tx_hex_string);
      uint32_t index = tx.GetTxInIndex(outpoint);
      if (clear_stack) {
        if (is_witness) {
          tx.RemoveScriptWitnessStackAll(index);
        } else {
          tx.SetUnlockingScript(index, Script());
        }
      }
      tx.AddScriptHashSign(outpoint, list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ConfidentialTransactionContext tx(tx_hex_string);
      uint32_t index = tx.GetTxInIndex(outpoint);
      if (clear_stack) {
        if (is_witness) {
          tx.RemoveScriptWitnessStackAll(index);
        } else {
          tx.SetUnlockingScript(index, Script());
        }
      }
      tx.AddScriptHashSign(outpoint, list, script, addr_type);
      *tx_string = CreateString(tx.GetHex());
#else
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Elements is not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}